

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::FrameSizeParam,_libaom_test::TestMode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
  _Var2;
  unique_ptr<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  uVar3;
  undefined1 uVar4;
  int iVar5;
  
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl !=
      ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      )._M_head_impl) {
    iVar5 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar5 == '\0') {
      _Var2._M_head_impl =
           (this->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
           .
           super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_false>
           ._M_head_impl.impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
           ._M_head_impl;
      if (_Var2._M_head_impl !=
          ((ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *)
          (this->end_).
          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
          .
          super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_false>
          ._M_head_impl.impl_._M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
          .
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
          )._M_head_impl) {
        iVar5 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])();
        if ((char)iVar5 == '\0') {
          uVar3._M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          .
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
          ._M_head_impl =
               (this->current_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
               .
               super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
               .super__Tuple_impl<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>_>.
               super__Head_base<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
               ._M_head_impl.impl_._M_t;
          if ((_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
               )uVar3._M_t.
                super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                .
                super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                ._M_head_impl !=
              (ParamIteratorInterface<libaom_test::TestMode> *)
              *(tuple<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                *)&(this->end_).
                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                   .super__Tuple_impl<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                   .
                   super__Head_base<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                   ._M_head_impl.impl_._M_t) {
            uVar4 = (**(code **)(*(long *)uVar3._M_t.
                                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                          .
                                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                                          ._M_head_impl + 0x30))();
            return (bool)uVar4;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }